

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O3

int doctest::detail::suiteOrderComparator(void *a,void *b)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  TestData *rhs;
  TestData *lhs;
  
  puVar1 = *a;
  puVar2 = *b;
  iVar3 = strcmp((char *)*puVar1,(char *)*puVar2);
  if (iVar3 == 0) {
    iVar3 = strcmp((char *)puVar1[3],(char *)puVar2[3]);
    if (iVar3 == 0) {
      iVar3 = *(int *)(puVar1 + 4) - *(int *)(puVar2 + 4);
    }
  }
  return iVar3;
}

Assistant:

int suiteOrderComparator(const void* a, const void* b) {
        const TestData* lhs = *static_cast<TestData* const*>(a);
        const TestData* rhs = *static_cast<TestData* const*>(b);

        int res = strcmp(lhs->m_suite, rhs->m_suite);
        if(res != 0)
            return res;
        return fileOrderComparator(a, b);
    }